

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O3

void __thiscall EOServer::~EOServer(EOServer *this)

{
  list<Client_*,_std::allocator<Client_*>_> *plVar1;
  EOClient *this_00;
  World *this_01;
  _List_node_base *p_Var2;
  EOClient *eoclient;
  double dVar3;
  double dVar4;
  PacketBuilder builder;
  PacketBuilder local_58;
  
  (this->super_Server)._vptr_Server = (_func_int **)&PTR_ClientFactory_001d1820;
  dVar3 = Timer::GetTime();
  PacketBuilder::PacketBuilder(&local_58,PACKET_MESSAGE,PACKET_CLOSE,0);
  PacketBuilder::AddByte(&local_58,'r');
  plVar1 = &(this->super_Server).clients;
  p_Var2 = (_List_node_base *)plVar1;
  while (p_Var2 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)plVar1) {
    this_00 = (EOClient *)p_Var2[1]._M_next;
    EOClient::Send(this_00,&local_58);
    Client::FinishWriting((Client *)this_00);
  }
  while (dVar4 = Timer::GetTime(), p_Var2 = (_List_node_base *)plVar1, dVar3 + 1.0 < dVar4) {
    Server::Select(&this->super_Server,0.1);
  }
  while (p_Var2 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)plVar1) {
    Client::Close((Client *)p_Var2[1]._M_next,false);
  }
  while ((this->super_Server).clients.super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
         _M_node._M_size != 0) {
    Server::Select(&this->super_Server,0.1);
    Server::BuryTheDead(&this->super_Server);
  }
  this_01 = this->world;
  if (this_01 != (World *)0x0) {
    World::~World(this_01);
  }
  operator_delete(this_01,0x980);
  PacketBuilder::~PacketBuilder(&local_58);
  std::
  _Hashtable<IPAddress,_std::pair<const_IPAddress,_ConnectionLogEntry>,_std::allocator<std::pair<const_IPAddress,_ConnectionLogEntry>_>,_std::__detail::_Select1st,_std::equal_to<IPAddress>,_std::hash<IPAddress>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->connection_log)._M_h);
  Server::~Server(&this->super_Server);
  return;
}

Assistant:

EOServer::~EOServer()
{
	double shutdown_start_time = Timer::GetTime();

	PacketBuilder builder(PACKET_MESSAGE, PACKET_CLOSE);
	builder.AddByte('r');

	// Send server reboot message
	for (Client* client : this->clients)
	{
		EOClient* eoclient = static_cast<EOClient*>(client);
		eoclient->Send(builder);
		eoclient->FinishWriting();
	}

	// Spend up to 1 second pumping the clients' send buffers dry
	while (shutdown_start_time + 1.0 < Timer::GetTime())
	{
		this->Select(0.1);
	}

	// All clients must be fully closed before the world ends
	UTIL_FOREACH(this->clients, client)
	{
		client->Close();
	}

	// Spend up to 2 seconds shutting down
	while (this->clients.size() > 0)
	{
		this->Select(0.1);
		this->BuryTheDead();
	}

	delete this->world;
}